

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig pvVar1;
  EGLConfig *__ptr;
  _GLFWfbconfig *p_Var2;
  uint uVar3;
  size_t __nmemb;
  int iVar4;
  long lVar5;
  int value;
  int nativeCount;
  uint local_68;
  int local_64;
  ulong local_60;
  _GLFWfbconfig *local_58;
  EGLConfig *local_50;
  _GLFWfbconfig *local_48;
  EGLConfig *local_40;
  _GLFWctxconfig *local_38;
  
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_64);
  iVar4 = local_64;
  if ((long)local_64 == 0) {
    uVar3 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    local_60 = 0;
    local_50 = result;
    local_48 = desired;
    __ptr = (EGLConfig *)calloc((long)local_64,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,__ptr,iVar4,&local_64);
    __nmemb = (size_t)local_64;
    local_58 = (_GLFWfbconfig *)calloc(__nmemb,0x48);
    if (0 < (long)__nmemb) {
      lVar5 = 0;
      local_60 = 0;
      local_40 = __ptr;
      local_38 = ctxconfig;
      do {
        pvVar1 = __ptr[lVar5];
        (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x303f,(EGLint *)&local_68);
        if ((((local_68 & 0x308e) != 0) &&
            ((*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3033,(EGLint *)&local_68),
            (local_68 & 4) != 0)) &&
           ((*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x302e,(EGLint *)&local_68),
           local_68 != 0)) {
          if (ctxconfig->client == 0x30001) {
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_68);
            uVar3 = local_68 & 8;
joined_r0x0019be2f:
            if (uVar3 == 0) goto LAB_0019be00;
          }
          else if (ctxconfig->client == 0x30002) {
            if (ctxconfig->major == 1) {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_68);
              uVar3 = local_68 & 1;
            }
            else {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_68);
              uVar3 = local_68 & 4;
            }
            goto joined_r0x0019be2f;
          }
          iVar4 = (int)local_60;
          p_Var2 = local_58 + iVar4;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3024,(EGLint *)&local_68);
          p_Var2->redBits = local_68;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3023,(EGLint *)&local_68);
          p_Var2->greenBits = local_68;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3022,(EGLint *)&local_68);
          p_Var2->blueBits = local_68;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3021,(EGLint *)&local_68);
          p_Var2->alphaBits = local_68;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3025,(EGLint *)&local_68);
          p_Var2->depthBits = local_68;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3026,(EGLint *)&local_68);
          p_Var2->stencilBits = local_68;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3031,(EGLint *)&local_68);
          p_Var2->samples = local_68;
          p_Var2->doublebuffer = 1;
          p_Var2->handle = (uintptr_t)pvVar1;
          local_60 = (ulong)(iVar4 + 1);
          __ptr = local_40;
          ctxconfig = local_38;
        }
LAB_0019be00:
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_64);
    }
    p_Var2 = _glfwChooseFBConfig(local_48,local_58,(uint)local_60);
    if (p_Var2 != (_GLFWfbconfig *)0x0) {
      *local_50 = (EGLConfig)p_Var2->handle;
    }
    uVar3 = (uint)(p_Var2 != (_GLFWfbconfig *)0x0);
    free(__ptr);
    free(local_58);
  }
  return uVar3;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) & EGL_RGB_BUFFER))
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        // Only consider EGLConfigs with associated Visuals
        if (!getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID))
            continue;
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}